

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::EncConfig::endEncrypt(EncConfig *this)

{
  Config *pCVar1;
  element_type *peVar2;
  string local_38;
  
  pCVar1 = this->config;
  peVar2 = (pCVar1->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->keylen == 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"encryption key length is required","");
    usage(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pCVar1 = this->config;
    peVar2 = (pCVar1->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar2->encrypt = true;
  peVar2->decrypt = false;
  peVar2->copy_encryption = false;
  return pCVar1;
}

Assistant:

QPDFJob::Config*
QPDFJob::EncConfig::endEncrypt()
{
    if (config->o.m->keylen == 0) {
        usage("encryption key length is required");
    }
    config->o.m->encrypt = true;
    config->o.m->decrypt = false;
    config->o.m->copy_encryption = false;
    return this->config;
}